

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O0

ErrorCode __thiscall
ComponentManager::GetService(ComponentManager *this,CID cid,IID iid,void **object)

{
  bool bVar1;
  ClassInfo **ppCVar2;
  void *pvVar3;
  undefined1 local_58 [16];
  iterator i;
  ClassInfo *info;
  ClassInfo match;
  ErrorCode result;
  void **object_local;
  ComponentManager *this_local;
  IID iid_local;
  CID cid_local;
  
  match.mClass._4_4_ = kNoError;
  iid_local.mId = cid.mId;
  ClassInfo::ClassInfo((ClassInfo *)&info,&iid_local,(ISupports *)0x0);
  i.mNode = (Node *)0x0;
  JetHead::list<ComponentManager::ClassInfo_*>::begin
            ((list<ComponentManager::ClassInfo_*> *)(local_58 + 8));
  do {
    JetHead::list<ComponentManager::ClassInfo_*>::end
              ((list<ComponentManager::ClassInfo_*> *)local_58);
    bVar1 = JetHead::list<ComponentManager::ClassInfo_*>::iterator::operator!=
                      ((iterator *)(local_58 + 8),(iterator *)local_58);
    JetHead::list<ComponentManager::ClassInfo_*>::iterator::~iterator((iterator *)local_58);
    if (!bVar1) {
LAB_001052db:
      JetHead::list<ComponentManager::ClassInfo_*>::iterator::~iterator((iterator *)(local_58 + 8));
      if (i.mNode == (Node *)0x0) {
        match.mClass._4_4_ = kNoClass;
      }
      else {
        pvVar3 = (void *)(*(code *)(i.mNode)->next->val[1].mCid.mId)
                                   ((i.mNode)->next,iid.mId,(undefined1 *)((long)&match.mClass + 4))
        ;
        *object = pvVar3;
      }
      return match.mClass._4_4_;
    }
    ppCVar2 = JetHead::list<ComponentManager::ClassInfo_*>::iterator::operator*
                        ((iterator *)(local_58 + 8));
    bVar1 = ClassInfo::operator==(*ppCVar2,(ClassInfo *)&info);
    if (bVar1) {
      ppCVar2 = JetHead::list<ComponentManager::ClassInfo_*>::iterator::operator*
                          ((iterator *)(local_58 + 8));
      i.mNode = (Node *)*ppCVar2;
      goto LAB_001052db;
    }
    JetHead::list<ComponentManager::ClassInfo_*>::iterator::operator++((iterator *)(local_58 + 8));
  } while( true );
}

Assistant:

ErrorCode ComponentManager::GetService( CID cid, IID iid, void **object )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	ErrorCode result = kNoError;
	ClassInfo match( cid );

	ClassInfo *info = NULL;

	for (JetHead::list<ClassInfo*>::iterator i = mClasses.begin(); 
		 i != mClasses.end(); ++i)
	{
		if (*(*i) == match)
		{
			info = *i;
			break;
		}
	}
	
	LOG( "info is %p", info );
	
	if ( info != NULL )
		*object = info->mClass->QueryInterface( iid, &result );
	else
		result = kNoClass;

	return result;
}